

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O2

ClockingPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ClockingPropertyExprSyntax,slang::syntax::ClockingPropertyExprSyntax_const&>
          (BumpAllocator *this,ClockingPropertyExprSyntax *args)

{
  SyntaxNode *pSVar1;
  SyntaxNode *pSVar2;
  TimingControlSyntax *pTVar3;
  undefined4 uVar4;
  ClockingPropertyExprSyntax *pCVar5;
  
  pCVar5 = (ClockingPropertyExprSyntax *)allocate(this,0x28,8);
  uVar4 = *(undefined4 *)&(args->super_PropertyExprSyntax).super_SyntaxNode.field_0x4;
  pSVar1 = (args->super_PropertyExprSyntax).super_SyntaxNode.parent;
  pSVar2 = (args->super_PropertyExprSyntax).super_SyntaxNode.previewNode;
  pTVar3 = (args->event).ptr;
  (pCVar5->super_PropertyExprSyntax).super_SyntaxNode.kind =
       (args->super_PropertyExprSyntax).super_SyntaxNode.kind;
  *(undefined4 *)&(pCVar5->super_PropertyExprSyntax).super_SyntaxNode.field_0x4 = uVar4;
  (pCVar5->super_PropertyExprSyntax).super_SyntaxNode.parent = pSVar1;
  (pCVar5->super_PropertyExprSyntax).super_SyntaxNode.previewNode = pSVar2;
  (pCVar5->event).ptr = pTVar3;
  pCVar5->expr = args->expr;
  return pCVar5;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }